

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

void lyd_insert_node_ordby_schema(lyd_node *parent,lyd_node **first_sibling,lyd_node *node)

{
  lyd_node *sibling;
  bool bVar1;
  lyd_node *local_40;
  lyd_node *local_30;
  lyd_node *local_28;
  lyd_node *anchor;
  lyd_node *node_local;
  lyd_node **first_sibling_local;
  lyd_node *parent_local;
  
  if ((first_sibling != (lyd_node **)0x0) && (node != (lyd_node *)0x0)) {
    sibling = lyd_insert_node_find_anchor(*first_sibling,node);
    if (sibling == (lyd_node *)0x0) {
      if (((*first_sibling == (lyd_node *)0x0) || (node->schema == (lysc_node *)0x0)) ||
         ((*first_sibling)->prev->schema != (lysc_node *)0x0)) {
        lyd_insert_node_last(parent,first_sibling,node);
      }
      else {
        local_28 = (*first_sibling)->prev;
        while( true ) {
          bVar1 = false;
          if (local_28 != *first_sibling) {
            bVar1 = local_28->prev->schema == (lysc_node *)0x0;
          }
          if (!bVar1) break;
          local_28 = local_28->prev;
        }
        lyd_insert_before_node(local_28,node);
        local_40 = node;
        if (*first_sibling != local_28) {
          local_40 = *first_sibling;
        }
        *first_sibling = local_40;
      }
    }
    else {
      lyd_insert_before_node(sibling,node);
      local_30 = node;
      if (*first_sibling != sibling) {
        local_30 = *first_sibling;
      }
      *first_sibling = local_30;
    }
    return;
  }
  __assert_fail("first_sibling && node",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                ,0x2d2,
                "void lyd_insert_node_ordby_schema(struct lyd_node *, struct lyd_node **, struct lyd_node *)"
               );
}

Assistant:

void
lyd_insert_node_ordby_schema(struct lyd_node *parent, struct lyd_node **first_sibling, struct lyd_node *node)
{
    struct lyd_node *anchor;

    assert(first_sibling && node);

    if ((anchor = lyd_insert_node_find_anchor(*first_sibling, node))) {
        lyd_insert_before_node(anchor, node);
        *first_sibling = *first_sibling != anchor ? *first_sibling : node;
    } else if (*first_sibling && node->schema && !(*first_sibling)->prev->schema) {
        /* cannot insert data node after opaque nodes */
        anchor = (*first_sibling)->prev;
        while ((anchor != *first_sibling) && !anchor->prev->schema) {
            anchor = anchor->prev;
        }
        lyd_insert_before_node(anchor, node);
        *first_sibling = *first_sibling != anchor ? *first_sibling : node;
    } else {
        lyd_insert_node_last(parent, first_sibling, node);
    }
}